

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_new_path_list_predicate(lyd_node *list,char *list_name,char *predicate,int *parsed)

{
  lys_node *plVar1;
  int iVar2;
  ushort **ppuVar3;
  LY_ERR *pLVar4;
  lyd_node *plVar5;
  lys_node_list *slist;
  int local_58;
  int has_predicate;
  int val_len;
  int nam_len;
  int i;
  int r;
  char *key_val;
  char *value;
  char *name;
  int *parsed_local;
  char *predicate_local;
  char *list_name_local;
  lyd_node *list_local;
  
  plVar1 = list->schema;
  name = (char *)parsed;
  parsed_local = (int *)predicate;
  predicate_local = list_name;
  list_name_local = (char *)list;
  nam_len = parse_schema_json_predicate
                      (predicate,&value,&has_predicate,&key_val,&local_58,(int *)((long)&slist + 4))
  ;
  if ((nam_len < 1) || (iVar2 = strncmp(value,".",(long)has_predicate), iVar2 == 0)) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)*(char *)((long)parsed_local + (long)-nam_len),
            (long)parsed_local + (long)-nam_len);
    list_local._4_4_ = -1;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)*value] & 0x800) == 0) {
      if (plVar1->padding[2] == '\0') {
        list_local._4_4_ = 0;
      }
      else {
        val_len = 0;
        do {
          *(int *)name = nam_len + *(int *)name;
          parsed_local = (int *)((long)parsed_local + (long)nam_len);
          if (((key_val == (char *)0x0) ||
              (iVar2 = strncmp((char *)**(undefined8 **)
                                         (*(long *)&plVar1[1].flags + (long)val_len * 8),value,
                               (long)has_predicate), iVar2 != 0)) ||
             (*(char *)(**(long **)(*(long *)&plVar1[1].flags + (long)val_len * 8) +
                       (long)has_predicate) != '\0')) {
            ly_vlog(LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,value);
            return -1;
          }
          _i = (char *)malloc((long)(local_58 + 1));
          if (_i == (char *)0x0) {
            pLVar4 = ly_errno_location();
            *pLVar4 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_new_path_list_predicate");
            return -1;
          }
          strncpy(_i,key_val,(long)local_58);
          _i[local_58] = '\0';
          plVar5 = _lyd_new_leaf((lyd_node *)list_name_local,
                                 *(lys_node **)(*(long *)&plVar1[1].flags + (long)val_len * 8),_i,0)
          ;
          if (plVar5 == (lyd_node *)0x0) {
            free(_i);
            return -1;
          }
          free(_i);
          val_len = val_len + 1;
          if ((int)(uint)plVar1->padding[2] <= val_len) {
            return 0;
          }
          if (slist._4_4_ == 0) {
            ly_vlog(LYE_PATH_MISSKEY,LY_VLOG_NONE,(void *)0x0,predicate_local);
            return -1;
          }
          nam_len = parse_schema_json_predicate
                              ((char *)parsed_local,&value,&has_predicate,&key_val,&local_58,
                               (int *)((long)&slist + 4));
        } while ((0 < nam_len) && (iVar2 = strncmp(value,".",(long)has_predicate), iVar2 != 0));
        ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                (ulong)(uint)(int)*(char *)((long)parsed_local + (long)-nam_len),
                (long)parsed_local + (long)-nam_len);
        list_local._4_4_ = -1;
      }
    }
    else {
      *(int *)name = nam_len + *(int *)name;
      list_local._4_4_ = 0;
    }
  }
  return list_local._4_4_;
}

Assistant:

static int
lyd_new_path_list_predicate(struct lyd_node *list, const char *list_name, const char *predicate, int *parsed)
{
    const char *name, *value;
    char *key_val;
    int r, i, nam_len, val_len, has_predicate;
    struct lys_node_list *slist;

    slist = (struct lys_node_list *)list->schema;

    /* is the predicate a number? */
    if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
        return -1;
    }

    if (isdigit(name[0])) {
        /* position index - creating without keys */
        *parsed += r;
        return 0;
    }

    /* it's not a number, so there must be some keys */
    if (!slist->keys_size) {
        /* there are none, so pretend we did not parse anything to get invalid char error later */
        return 0;
    }

    /* go through all the keys */
    i = 0;
    goto check_parsed_values;

    for (; i < slist->keys_size; ++i) {
        if (!has_predicate) {
            LOGVAL(LYE_PATH_MISSKEY, LY_VLOG_NONE, NULL, list_name);
            return -1;
        }

        if (((r = parse_schema_json_predicate(predicate, &name, &nam_len, &value, &val_len, &has_predicate)) < 1)
                || !strncmp(name, ".", nam_len)) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-r], &predicate[-r]);
            return -1;
        }

check_parsed_values:
        *parsed += r;
        predicate += r;

        if (!value || strncmp(slist->keys[i]->name, name, nam_len) || slist->keys[i]->name[nam_len]) {
            LOGVAL(LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }

        key_val = malloc((val_len + 1) * sizeof(char));
        if (!key_val) {
            LOGMEM;
            return -1;
        }
        strncpy(key_val, value, val_len);
        key_val[val_len] = '\0';

        if (!_lyd_new_leaf(list, (const struct lys_node *)slist->keys[i], key_val, 0)) {
            free(key_val);
            return -1;
        }
        free(key_val);
    }

    return 0;
}